

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O1

bool string_empty_value::is_empty_value(string *v)

{
  int iVar1;
  bool bVar2;
  undefined2 local_18;
  undefined1 local_16;
  
  local_18 = 0;
  local_16 = 0;
  if (v->_M_string_length == 2) {
    iVar1 = bcmp((v->_M_dataplus)._M_p,&local_18,2);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool is_empty_value(const std::string& v) { return v == std::string("\0\0", 2); }